

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_string_tests.cpp
# Opt level: O1

void util_string_tests::FailFmtWithError<2u>(string_view wrong_fmt,string_view error)

{
  char *pcVar1;
  char *extraout_RDX;
  iterator in_R8;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file;
  string_view str;
  const_string file_00;
  const_string msg;
  const_string msg_00;
  check_type cVar2;
  char *local_c0;
  char *local_b8;
  lazy_ostream local_b0;
  undefined1 *local_a0;
  char *local_98;
  assertion_result local_90;
  undefined1 *local_78;
  undefined1 *local_70;
  char *local_68;
  char *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  str._M_len = wrong_fmt._M_str;
  pcVar1 = error._M_str;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_string_tests.cpp"
  ;
  local_40 = "";
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x1a;
  file.m_begin = (iterator)&local_48;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_58,msg);
  str._M_str = extraout_RDX;
  util::ConstevalFormatString<2U>::Detail_CheckNumFormatSpecifiers
            ((ConstevalFormatString<2U> *)wrong_fmt._M_len,str);
  local_68 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_string_tests.cpp"
  ;
  local_60 = "";
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x1a;
  file_00.m_begin = (iterator)&local_68;
  msg_00.m_end = in_R9;
  msg_00.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_78,msg_00
            );
  local_90.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x0;
  local_90.m_message.px = (element_type *)0x0;
  local_90.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_empty = false;
  local_b0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ab518;
  local_a0 = boost::unit_test::lazy_ostream::inst;
  local_98 = "exception ErrType expected but not raised";
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/util_string_tests.cpp"
  ;
  local_b8 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_90,&local_b0,1,1,WARN,_cVar2,(size_t)&local_c0,0x1a,pcVar1);
  boost::detail::shared_count::~shared_count(&local_90.m_message.pn);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

inline void FailFmtWithError(std::string_view wrong_fmt, std::string_view error)
{
    using ErrType = const char*;
    auto check_throw{[error](const ErrType& str) { return str == error; }};
    BOOST_CHECK_EXCEPTION(util::ConstevalFormatString<WrongNumArgs>::Detail_CheckNumFormatSpecifiers(wrong_fmt), ErrType, check_throw);
}